

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbeddingValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)2005>(Result *__return_storage_ptr__,Model *format)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  bool bVar1;
  uint32_t uVar2;
  CoreML *pCVar3;
  ulong uVar4;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  WordEmbedding *local_140;
  WordEmbedding *wordEmbedding;
  iterator local_130;
  size_type local_128;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_120;
  Result local_108;
  undefined4 local_dc;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_d5;
  TypeCase local_d4;
  iterator local_d0;
  size_type local_c8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_c0;
  Result local_a8;
  undefined1 local_80 [8];
  Result result;
  allocator<char> local_41;
  string local_40;
  ModelDescription *local_20;
  ModelDescription *interface;
  Model *format_local;
  
  interface = (ModelDescription *)format;
  format_local = (Model *)__return_storage_ptr__;
  local_20 = Specification::Model::description(format);
  bVar1 = Specification::Model::has_wordembedding((Model *)interface);
  if (bVar1) {
    Result::Result((Result *)local_80);
    pCVar3 = (CoreML *)Specification::ModelDescription::input(local_20);
    local_d4 = kStringType;
    local_d0 = &local_d4;
    local_c8 = 1;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_d5);
    __l_00._M_len = local_c8;
    __l_00._M_array = local_d0;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_c0,__l_00,&local_d5);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (&local_a8,pCVar3,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
               (int)&local_c0,in_R8);
    Result::operator=((Result *)local_80,&local_a8);
    Result::~Result(&local_a8);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector(&local_c0);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_d5);
    bVar1 = Result::good((Result *)local_80);
    if (bVar1) {
      pCVar3 = (CoreML *)Specification::ModelDescription::output(local_20);
      wordEmbedding._4_4_ = 5;
      local_130 = (iterator)((long)&wordEmbedding + 4);
      local_128 = 1;
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator
                ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
                 ((long)&wordEmbedding + 3));
      __l._M_len = local_128;
      __l._M_array = local_130;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_120,__l,
               (allocator<CoreML::Specification::FeatureType::TypeCase> *)((long)&wordEmbedding + 3)
              );
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                (&local_108,pCVar3,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_120,
                 in_R8);
      Result::operator=((Result *)local_80,&local_108);
      Result::~Result(&local_108);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector(&local_120);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
                ((allocator<CoreML::Specification::FeatureType::TypeCase> *)
                 ((long)&wordEmbedding + 3));
      bVar1 = Result::good((Result *)local_80);
      if (bVar1) {
        local_140 = Specification::Model::wordembedding((Model *)interface);
        uVar2 = Specification::CoreMLModels::WordEmbedding::revision(local_140);
        if (uVar2 < 2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_160,"Model revision number missing or invalid. Must be >= 2",
                     &local_161);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator(&local_161);
        }
        else {
          Specification::CoreMLModels::WordEmbedding::modelparameterdata_abi_cxx11_(local_140);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            Result::Result(__return_storage_ptr__,(Result *)local_80);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_188,"Model parameter data not set",&local_189);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_188);
            std::__cxx11::string::~string((string *)&local_188);
            std::allocator<char>::~allocator(&local_189);
          }
        }
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_80);
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_80);
    }
    local_dc = 1;
    Result::~Result((Result *)local_80);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Model not a word embedding.",&local_41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_wordEmbedding>(const Specification::Model& format) {
        const auto& interface = format.description();
        
        // make sure model is a word embedding
        if (!format.has_wordembedding()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a word embedding.");
        }
        
        Result result;
        
        // Validate the inputs: only one input with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the output: only one output with double vector (1d multiArray) type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the model parameters
        const auto &wordEmbedding = format.wordembedding();
        if (wordEmbedding.revision() < 2) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model revision number missing or invalid. Must be >= 2");
        }
        
        if (wordEmbedding.modelparameterdata().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model parameter data not set");
        }
        
        return result;
    }